

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itree.c
# Opt level: O0

cell_id_t itree_enum(void)

{
  cell_index_t cVar1;
  uint uVar2;
  cell_index_t nxt;
  
  cVar1 = base->cell[posn].sib;
  if (cVar1 == 0xffffffff) {
    uVar2 = base->cell[right].sib;
    if (uVar2 == 0xffffffff) {
      uVar2 = base->cell[left].sib;
      if (uVar2 == 0xffffffff) {
        return 0xffffffff;
      }
      right = base->cell[uVar2].child;
      left = uVar2;
      cVar1 = base->cell[right].child;
    }
    else {
      right = uVar2;
      cVar1 = base->cell[uVar2].child;
    }
  }
  posn = cVar1;
  return base->cell[posn].child;
}

Assistant:

cell_id_t
itree_enum()
{
    cell_index_t nxt;

    nxt = base->cell[posn].sib;		/* get next posn (given left and right) */
    if (nxt != NULL_INDEX) {
	/* exists, so set the posn leaf node to the next one */
	posn = nxt;
    }
    else {
	/* no next posn (given left and right) */
	/* therefore get the next right context if any */

	nxt = base->cell[right].sib;
	if (nxt != NULL_INDEX) {
	    /* found a next right context, so save it */
	    right = nxt;

	    /* set the posn to the first position given the new right */
	    posn = base->cell[right].child;
	}
	else {
	    /* no next right context exists */
	    /* therefore get a new left context if any */
	    nxt = base->cell[left].sib;
	    if (nxt != NULL_INDEX) {
		/* a next left context exists so save it */
		left = nxt;
		/* get the first right context given the left */
		right = base->cell[left].child;

		/* get the first posn given the left and right */
		posn = base->cell[right].child;
	    }
	    else {
		return NULL_INDEX;	/* no more left contexts, so the
					   whole tree for this base phone
					   has been enumerated */
	    }
	}
    }

    /* if we arrive here, posn will reference the cell with the
       next triphone id */

    return base->cell[posn].child;
}